

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O3

bool __thiscall efsw::FileWatcherInotify::pathInWatches(FileWatcherInotify *this,string *path)

{
  pointer __s2;
  _Base_ptr __n;
  int iVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  
  Mutex::lock(&this->mRealWatchesLock);
  p_Var2 = (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    __s2 = (path->_M_dataplus)._M_p;
    __n = (_Base_ptr)path->_M_string_length;
    do {
      if ((p_Var2[1]._M_parent)->_M_right == __n) {
        bVar3 = true;
        if (__n == (_Base_ptr)0x0) goto LAB_0010cb6c;
        iVar1 = bcmp((p_Var2[1]._M_parent)->_M_left,__s2,(size_t)__n);
        if (iVar1 == 0) goto LAB_0010cb6c;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  bVar3 = false;
LAB_0010cb6c:
  Mutex::unlock(&this->mRealWatchesLock);
  return bVar3;
}

Assistant:

bool FileWatcherInotify::pathInWatches( const std::string& path ) {
	Lock l( mRealWatchesLock );

	/// Search in the real watches, since it must allow adding a watch already watched as a subdir
	WatchMap::iterator it = mRealWatches.begin();

	for ( ; it != mRealWatches.end(); ++it )
		if ( it->second->Directory == path )
			return true;

	return false;
}